

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGImpactQuantizedBvh.h
# Opt level: O0

void __thiscall
btQuantizedBvhTree::getNodeBound(btQuantizedBvhTree *this,int nodeindex,btAABB *bound)

{
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  unsigned_short *vecIn;
  btVector3 bVar1;
  btVector3 *in_stack_ffffffffffffffd0;
  btVector3 *in_stack_ffffffffffffffd8;
  btVector3 *offset;
  unsigned_short *in_stack_ffffffffffffffe0;
  
  btAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::operator[]
            ((btAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *)(in_RDI + 8),in_ESI);
  bVar1 = bt_unquantize(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                        in_stack_ffffffffffffffd0);
  vecIn = bVar1.m_floats._8_8_;
  offset = bVar1.m_floats._0_8_;
  *in_RDX = offset;
  in_RDX[1] = vecIn;
  btAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::operator[]
            ((btAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *)(in_RDI + 8),in_ESI);
  bVar1 = bt_unquantize(vecIn,offset,in_stack_ffffffffffffffd0);
  in_RDX[2] = bVar1.m_floats._0_8_;
  in_RDX[3] = bVar1.m_floats._8_8_;
  return;
}

Assistant:

SIMD_FORCE_INLINE void getNodeBound(int nodeindex, btAABB & bound) const
	{
		bound.m_min = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMin,
			m_global_bound.m_min,m_bvhQuantization);

		bound.m_max = bt_unquantize(
			m_node_array[nodeindex].m_quantizedAabbMax,
			m_global_bound.m_min,m_bvhQuantization);
	}